

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

void __thiscall capnp::_::OrphanBuilder::euthanize(OrphanBuilder *this)

{
  ExceptionCallback *pEVar1;
  Maybe<kj::Exception> exception;
  Runnable local_178;
  OrphanBuilder *local_170;
  NullableValue<kj::Exception> local_168;
  
  local_178._vptr_Runnable = (_func_int **)&PTR_run_003a1ac8;
  local_170 = this;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_168,&local_178);
  if (local_168.isSet == true) {
    pEVar1 = kj::getExceptionCallback();
    (*pEVar1->_vptr_ExceptionCallback[2])(pEVar1,&local_168.field_1);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_168);
  return;
}

Assistant:

KJ_ALWAYS_INLINE(bool isNull() const) {
    // If the upper 32 bits are zero, this is a pointer to an empty struct.  We consider that to be
    // our "null" value.
    return (offsetAndKind.get() == 0) & (upper32Bits == 0);
  }